

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu5xx_common.c
# Opt level: O2

VepuRgb2YuvCfg * get_rgb2yuv_cfg(MppFrameColorRange range,MppFrameColorSpace color)

{
  VepuRgb2YuvCfg *pVVar1;
  VepuRgb2YuvCfg *pVVar2;
  
  pVVar2 = vepu_rgb2limit_yuv_cfg_set;
  pVVar1 = vepu_rgb2limit_yuv_cfg_set;
  if (range == MPP_FRAME_RANGE_JPEG) {
    pVVar2 = vepu_rgb2full_yuv_cfg_set;
    pVVar1 = vepu_rgb2full_yuv_cfg_set;
  }
  pVVar1 = pVVar1 + 1;
  if (pVVar2[1].color != color) {
    pVVar1 = pVVar2;
  }
  if (pVVar2->color == color) {
    pVVar1 = pVVar2;
  }
  return pVVar1;
}

Assistant:

const VepuRgb2YuvCfg *get_rgb2yuv_cfg(MppFrameColorRange range, MppFrameColorSpace color)
{
    const VepuRgb2YuvCfg *cfg;
    RK_U32 size;
    RK_U32 i;

    /* only jpeg full range, others limit range */
    if (range == MPP_FRAME_RANGE_JPEG) {
        /* set default cfg BT.601 */
        cfg = &vepu_rgb2full_yuv_cfg_set[0];
        size = MPP_ARRAY_ELEMS(vepu_rgb2full_yuv_cfg_set);
    } else {
        /* set default cfg BT.601 */
        cfg = &vepu_rgb2limit_yuv_cfg_set[0];
        size = MPP_ARRAY_ELEMS(vepu_rgb2limit_yuv_cfg_set);
    }

    for (i = 0; i < size; i++)
        if (cfg[i].color == color)
            return &cfg[i];

    return cfg;
}